

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * operator+=(QString *a,QStringBuilder<const_char_(&)[4],_QString> *b)

{
  ArrayOptions *pAVar1;
  ulong uVar2;
  Data *pDVar3;
  long lVar4;
  ulong uVar5;
  char16_t *__src;
  long lVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QChar *it;
  QChar *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (a->d).d;
  uVar5 = (a->d).size;
  uVar7 = uVar5 + (b->b).d.size + 3;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)uVar5);
    pDVar3 = (a->d).d;
    uVar5 = (a->d).size;
    uVar2 = uVar7;
    if (pDVar3 != (Data *)0x0) goto LAB_001cf105;
LAB_001cf14d:
    if (uVar2 < uVar5) {
      uVar2 = uVar5;
    }
    QString::reallocData((longlong)a,(AllocationOption)uVar2);
    pDVar3 = (a->d).d;
    if (pDVar3 != (Data *)0x0) {
      lVar4 = (pDVar3->super_QArrayData).alloc;
LAB_001cf170:
      if (lVar4 != 0) {
        pAVar1 = &(pDVar3->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
      goto LAB_001cf179;
    }
  }
  else {
LAB_001cf105:
    lVar4 = (pDVar3->super_QArrayData).alloc;
    lVar6 = (long)((long)(a->d).ptr -
                  ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1
    ;
    if ((long)((lVar4 - uVar5) - lVar6) < (long)uVar7) {
      uVar2 = lVar4 * 2;
      if (lVar4 * 2 < (long)uVar7) {
        uVar2 = uVar7;
      }
      if ((1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar4 - lVar6 <= (long)uVar2)) goto LAB_001cf14d;
      goto LAB_001cf170;
    }
LAB_001cf179:
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_001cf191;
  }
  QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_001cf191:
  local_28 = (QChar *)((a->d).ptr + (a->d).size);
  QVar8.m_data = *b->a;
  QVar8.m_size = 3;
  QAbstractConcatenable::convertFromUtf8(QVar8,&local_28);
  lVar4 = (b->b).d.size;
  if (lVar4 != 0) {
    __src = (b->b).d.ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(local_28,__src,lVar4 * 2);
  }
  local_28 = local_28 + lVar4;
  QString::resize((longlong)a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return a;
  }
  __stack_chk_fail();
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}